

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_dependency_base<VkSubpassDependency2>
               (Hasher *h,VkSubpassDependency2 *dep)

{
  VkSubpassDependency2 *dep_local;
  Hasher *h_local;
  
  Hasher::u32(h,dep->dependencyFlags);
  Hasher::u32(h,dep->dstAccessMask);
  Hasher::u32(h,dep->srcAccessMask);
  Hasher::u32(h,dep->srcSubpass);
  Hasher::u32(h,dep->dstSubpass);
  Hasher::u32(h,dep->srcStageMask);
  Hasher::u32(h,dep->dstStageMask);
  return;
}

Assistant:

static void hash_dependency_base(Hasher &h, const Dep &dep)
{
	h.u32(dep.dependencyFlags);
	h.u32(dep.dstAccessMask);
	h.u32(dep.srcAccessMask);
	h.u32(dep.srcSubpass);
	h.u32(dep.dstSubpass);
	h.u32(dep.srcStageMask);
	h.u32(dep.dstStageMask);
}